

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void updateNormalHints(_GLFWwindow *window,int width,int height)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  XSizeHints *pXVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  pXVar4 = (*_glfw.x11.xlib.AllocSizeHints)();
  if (window->monitor == (_GLFWmonitor *)0x0) {
    if (window->resizable == 0) {
      lVar5 = 0x1c;
      lVar6 = 0x24;
      lVar7 = 0x18;
      lVar8 = 0x20;
      uVar9 = 0x30;
    }
    else {
      iVar2 = window->minwidth;
      if ((iVar2 != -1) && (iVar3 = window->minheight, iVar3 != -1)) {
        *(byte *)&pXVar4->flags = (byte)pXVar4->flags | 0x10;
        pXVar4->min_width = iVar2;
        pXVar4->min_height = iVar3;
      }
      iVar2 = window->maxwidth;
      if ((iVar2 != -1) && (iVar3 = window->maxheight, iVar3 != -1)) {
        *(byte *)&pXVar4->flags = (byte)pXVar4->flags | 0x20;
        pXVar4->max_width = iVar2;
        pXVar4->max_height = iVar3;
      }
      width = window->numer;
      if ((width == -1) || (height = window->denom, height == -1)) goto LAB_00114a04;
      lVar5 = 0x34;
      lVar6 = 0x3c;
      lVar7 = 0x30;
      lVar8 = 0x38;
      uVar9 = 0x80;
    }
    pXVar4->flags = pXVar4->flags | uVar9;
    *(int *)((long)&pXVar4->flags + lVar8) = width;
    *(int *)((long)&pXVar4->flags + lVar7) = width;
    *(int *)((long)&pXVar4->flags + lVar6) = height;
    *(int *)((long)&pXVar4->flags + lVar5) = height;
  }
LAB_00114a04:
  pbVar1 = (byte *)((long)&pXVar4->flags + 1);
  *pbVar1 = *pbVar1 | 2;
  pXVar4->win_gravity = 10;
  (*_glfw.x11.xlib.SetWMNormalHints)(_glfw.x11.display,(window->x11).handle,pXVar4);
  (*_glfw.x11.xlib.Free)(pXVar4);
  return;
}

Assistant:

static void updateNormalHints(_GLFWwindow* window, int width, int height)
{
    XSizeHints* hints = XAllocSizeHints();

    if (!window->monitor)
    {
        if (window->resizable)
        {
            if (window->minwidth != GLFW_DONT_CARE &&
                window->minheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMinSize;
                hints->min_width = window->minwidth;
                hints->min_height = window->minheight;
            }

            if (window->maxwidth != GLFW_DONT_CARE &&
                window->maxheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMaxSize;
                hints->max_width = window->maxwidth;
                hints->max_height = window->maxheight;
            }

            if (window->numer != GLFW_DONT_CARE &&
                window->denom != GLFW_DONT_CARE)
            {
                hints->flags |= PAspect;
                hints->min_aspect.x = hints->max_aspect.x = window->numer;
                hints->min_aspect.y = hints->max_aspect.y = window->denom;
            }
        }
        else
        {
            hints->flags |= (PMinSize | PMaxSize);
            hints->min_width  = hints->max_width  = width;
            hints->min_height = hints->max_height = height;
        }
    }

    hints->flags |= PWinGravity;
    hints->win_gravity = StaticGravity;

    XSetWMNormalHints(_glfw.x11.display, window->x11.handle, hints);
    XFree(hints);
}